

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzd_additional.c
# Opt level: O0

void mzd_addmul_v_s256_256(mzd_local_t *c,mzd_local_t *v,mzd_local_t *A)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  size_t *in_RDX;
  ulong *in_RDI;
  size_t sVar6;
  word idx_00;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  uint i;
  word idx;
  uint w;
  word256 cval [2];
  block_t *Ablock;
  word *vptr;
  block_t *cblock;
  size_t bit;
  word idx_01;
  int local_394;
  int local_384;
  ulong local_380;
  ulong uStack_378;
  ulong uStack_370;
  ulong uStack_368;
  ulong local_360;
  ulong uStack_358;
  ulong uStack_350;
  ulong uStack_348;
  size_t *local_330;
  ulong local_240;
  ulong uStack_238;
  ulong uStack_230;
  ulong uStack_228;
  ulong local_200;
  ulong uStack_1f8;
  ulong uStack_1f0;
  ulong uStack_1e8;
  ulong local_1c0;
  ulong uStack_1b8;
  ulong uStack_1b0;
  ulong uStack_1a8;
  ulong local_180;
  ulong uStack_178;
  ulong uStack_170;
  ulong uStack_168;
  
  local_380 = *in_RDI;
  uStack_378 = in_RDI[1];
  uStack_370 = in_RDI[2];
  uStack_368 = in_RDI[3];
  local_360 = 0;
  uStack_358 = 0;
  uStack_350 = 0;
  uStack_348 = 0;
  local_330 = in_RDX;
  for (local_384 = 4; local_384 != 0; local_384 = local_384 + -1) {
    for (local_394 = 0x40; local_394 != 0; local_394 = local_394 + -4) {
      sVar6 = *local_330;
      idx_00 = local_330[1];
      sVar7 = local_330[2];
      sVar9 = local_330[3];
      sVar8 = sVar7;
      sVar10 = sVar9;
      bit = sVar6;
      idx_01 = idx_00;
      mm256_compute_mask(idx_00,sVar6);
      auVar5._8_8_ = idx_01;
      auVar5._0_8_ = bit;
      auVar5._16_8_ = sVar7;
      auVar5._24_8_ = sVar9;
      auVar4._8_8_ = idx_00;
      auVar4._0_8_ = sVar6;
      auVar4._16_8_ = sVar8;
      auVar4._24_8_ = sVar10;
      auVar1 = vpand_avx2(auVar5,auVar4);
      local_180 = auVar1._0_8_;
      uStack_178 = auVar1._8_8_;
      uStack_170 = auVar1._16_8_;
      uStack_168 = auVar1._24_8_;
      sVar6 = *(size_t *)*(undefined1 (*) [32])(local_330 + 4);
      sVar7 = local_330[5];
      sVar9 = local_330[6];
      sVar8 = local_330[7];
      auVar1 = *(undefined1 (*) [32])(local_330 + 4);
      mm256_compute_mask(idx_01,bit);
      auVar3._8_8_ = sVar7;
      auVar3._0_8_ = sVar6;
      auVar3._16_8_ = sVar9;
      auVar3._24_8_ = sVar8;
      auVar1 = vpand_avx2(auVar1,auVar3);
      local_1c0 = auVar1._0_8_;
      uStack_1b8 = auVar1._8_8_;
      uStack_1b0 = auVar1._16_8_;
      uStack_1a8 = auVar1._24_8_;
      sVar6 = *(size_t *)*(undefined1 (*) [32])(local_330 + 8);
      sVar7 = local_330[9];
      sVar9 = local_330[10];
      sVar8 = local_330[0xb];
      auVar1 = *(undefined1 (*) [32])(local_330 + 8);
      mm256_compute_mask(idx_01,bit);
      auVar2._8_8_ = sVar7;
      auVar2._0_8_ = sVar6;
      auVar2._16_8_ = sVar9;
      auVar2._24_8_ = sVar8;
      auVar1 = vpand_avx2(auVar1,auVar2);
      local_200 = auVar1._0_8_;
      uStack_1f8 = auVar1._8_8_;
      uStack_1f0 = auVar1._16_8_;
      uStack_1e8 = auVar1._24_8_;
      local_380 = local_380 ^ local_180 ^ local_200;
      uStack_378 = uStack_378 ^ uStack_178 ^ uStack_1f8;
      uStack_370 = uStack_370 ^ uStack_170 ^ uStack_1f0;
      uStack_368 = uStack_368 ^ uStack_168 ^ uStack_1e8;
      sVar6 = *(size_t *)*(undefined1 (*) [32])(local_330 + 0xc);
      sVar7 = local_330[0xd];
      sVar9 = local_330[0xe];
      sVar8 = local_330[0xf];
      auVar2 = *(undefined1 (*) [32])(local_330 + 0xc);
      mm256_compute_mask(idx_01,bit);
      auVar1._8_8_ = sVar7;
      auVar1._0_8_ = sVar6;
      auVar1._16_8_ = sVar9;
      auVar1._24_8_ = sVar8;
      auVar1 = vpand_avx2(auVar2,auVar1);
      local_240 = auVar1._0_8_;
      uStack_238 = auVar1._8_8_;
      uStack_230 = auVar1._16_8_;
      uStack_228 = auVar1._24_8_;
      local_360 = local_360 ^ local_1c0 ^ local_240;
      uStack_358 = uStack_358 ^ uStack_1b8 ^ uStack_238;
      uStack_350 = uStack_350 ^ uStack_1b0 ^ uStack_230;
      uStack_348 = uStack_348 ^ uStack_1a8 ^ uStack_228;
      local_330 = local_330 + 0x10;
    }
  }
  *in_RDI = local_380 ^ local_360;
  in_RDI[1] = uStack_378 ^ uStack_358;
  in_RDI[2] = uStack_370 ^ uStack_350;
  in_RDI[3] = uStack_368 ^ uStack_348;
  return;
}

Assistant:

ATTR_TARGET_AVX2
void mzd_addmul_v_s256_256(mzd_local_t* c, mzd_local_t const* v, mzd_local_t const* A) {
  block_t* cblock       = BLOCK(c, 0);
  const word* vptr      = CONST_BLOCK(v, 0)->w64;
  const block_t* Ablock = CONST_BLOCK(A, 0);

  word256 cval[2] = {mm256_load(cblock->w64), mm256_zero};
  for (unsigned int w = 4; w; --w, ++vptr) {
    word idx = *vptr;
    for (unsigned int i = sizeof(word) * 8; i; i -= 4, idx >>= 4, Ablock += 4) {
      cval[0] = mm256_xor_mask(cval[0], mm256_load(Ablock[0].w64), mm256_compute_mask(idx, 0));
      cval[1] = mm256_xor_mask(cval[1], mm256_load(Ablock[1].w64), mm256_compute_mask(idx, 1));
      cval[0] = mm256_xor_mask(cval[0], mm256_load(Ablock[2].w64), mm256_compute_mask(idx, 2));
      cval[1] = mm256_xor_mask(cval[1], mm256_load(Ablock[3].w64), mm256_compute_mask(idx, 3));
    }
  }
  mm256_store(cblock->w64, mm256_xor(cval[0], cval[1]));
}